

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall
BackwardPass::ProcessArrayRegOpndUse(BackwardPass *this,Instr *instr,ArrayRegOpnd *arrayRegOpnd)

{
  BVSparse<Memory::JitArenaAllocator> *pBVar1;
  code *pcVar2;
  anon_class_32_4_791ecad1 IsCheckedUse;
  Instr *this_00;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  BOOLEAN BVar6;
  undefined4 *puVar7;
  StackSym *pSVar8;
  Opnd *pOVar9;
  RegOpnd *pRVar10;
  StackSym *pSVar11;
  IndirOpnd *this_01;
  Opnd *pOVar12;
  StackSym *local_f8;
  byte local_c9;
  byte local_b9;
  StackSym *lengthSym;
  Opnd *use_2;
  Opnd *use_1;
  Instr *noImplicitCallUsesInstr;
  long local_70;
  undefined1 *local_68;
  bool *local_60;
  Opnd *local_58;
  Opnd *use;
  ArrayRegOpnd *noImplicitCallArrayUse;
  Instr *headSegmentLengthLoad;
  Instr *upperBoundCheck;
  bool headSegmentLengthIsLoadedButUnused;
  BasicBlock *pBStack_30;
  bool headSegmentIsLoadedButUnused;
  BasicBlock *block;
  bool isJsArray;
  ArrayRegOpnd *pAStack_20;
  ValueType arrayValueType;
  ArrayRegOpnd *arrayRegOpnd_local;
  Instr *instr_local;
  BackwardPass *this_local;
  
  pAStack_20 = arrayRegOpnd;
  if (this->tag != DeadStorePhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1230,"(tag == Js::DeadStorePhase)","tag == Js::DeadStorePhase");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar3 = IsCollectionPass(this);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1231,"(!IsCollectionPass())","!IsCollectionPass()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1232,"(instr)","instr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (pAStack_20 == (ArrayRegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1233,"(arrayRegOpnd)","arrayRegOpnd");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pSVar8 = IR::ArrayRegOpnd::HeadSegmentSym(pAStack_20);
  if (((pSVar8 != (StackSym *)0x0) ||
      (pSVar8 = IR::ArrayRegOpnd::HeadSegmentLengthSym(pAStack_20), pSVar8 != (StackSym *)0x0)) ||
     (pSVar8 = IR::ArrayRegOpnd::LengthSym(pAStack_20), pSVar8 != (StackSym *)0x0)) {
    block._6_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                  IR::Opnd::GetValueType((Opnd *)pAStack_20);
    bVar3 = ValueType::IsLikelyTypedArray((ValueType *)((long)&block + 6));
    bVar3 = (bool)((bVar3 ^ 0xffU) & 1);
    block._5_1_ = bVar3;
    bVar4 = ValueType::IsArrayOrObjectWithArray((ValueType *)((long)&block + 6));
    if (bVar3 != bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x123c,"(isJsArray == arrayValueType.IsArrayOrObjectWithArray())",
                         "isJsArray == arrayValueType.IsArrayOrObjectWithArray()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    bVar5 = block._5_1_ ^ 0xff;
    bVar3 = ValueType::IsOptimizedTypedArray((ValueType *)((long)&block + 6));
    if ((bool)(bVar5 & 1) != bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x123d,"(!isJsArray == arrayValueType.IsOptimizedTypedArray())",
                         "!isJsArray == arrayValueType.IsOptimizedTypedArray()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pBStack_30 = this->currentBlock;
    bVar3 = IsPrePass(this);
    if (((!bVar3) &&
        ((pSVar8 = IR::ArrayRegOpnd::HeadSegmentSym(pAStack_20), pSVar8 != (StackSym *)0x0 ||
         (pSVar8 = IR::ArrayRegOpnd::HeadSegmentLengthSym(pAStack_20), pSVar8 != (StackSym *)0x0))))
       && (((block._5_1_ & 1) == 0 || (instr->m_opcode != NoImplicitCallUses)))) {
      local_b9 = 0;
      if ((*(ushort *)&instr->field_0x36 >> 10 & 1) != 0) {
        pSVar8 = IR::ArrayRegOpnd::HeadSegmentSym(pAStack_20);
        local_b9 = 0;
        if (pSVar8 != (StackSym *)0x0) {
          pBVar1 = pBStack_30->upwardExposedUses;
          pSVar8 = IR::ArrayRegOpnd::HeadSegmentSym(pAStack_20);
          BVar6 = BVSparse<Memory::JitArenaAllocator>::Test(pBVar1,(pSVar8->super_Sym).m_id);
          local_b9 = BVar6 != '\0' ^ 0xff;
        }
      }
      upperBoundCheck._7_1_ = local_b9 & 1;
      local_c9 = 0;
      if ((*(ushort *)&instr->field_0x36 >> 0xb & 1) != 0) {
        pSVar8 = IR::ArrayRegOpnd::HeadSegmentLengthSym(pAStack_20);
        local_c9 = 0;
        if (pSVar8 != (StackSym *)0x0) {
          pBVar1 = pBStack_30->upwardExposedUses;
          pSVar8 = IR::ArrayRegOpnd::HeadSegmentLengthSym(pAStack_20);
          BVar6 = BVSparse<Memory::JitArenaAllocator>::Test(pBVar1,(pSVar8->super_Sym).m_id);
          local_c9 = BVar6 != '\0' ^ 0xff;
        }
      }
      upperBoundCheck._6_1_ = local_c9 & 1;
      if ((upperBoundCheck._6_1_ != 0) && ((*(ushort *)&instr->field_0x36 >> 0xc & 1) != 0)) {
        headSegmentLengthLoad = GlobOpt::FindUpperBoundsCheckInstr(this->globOpt,instr);
        if ((headSegmentLengthLoad == (Instr *)0x0) || (headSegmentLengthLoad == instr)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1250,"(upperBoundCheck && upperBoundCheck != instr)",
                             "upperBoundCheck && upperBoundCheck != instr");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        pOVar9 = IR::Instr::GetSrc2(headSegmentLengthLoad);
        pRVar10 = IR::Opnd::AsRegOpnd(pOVar9);
        pSVar8 = pRVar10->m_sym;
        pSVar11 = IR::ArrayRegOpnd::HeadSegmentLengthSym(pAStack_20);
        if (pSVar8 != pSVar11) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1251,
                             "(upperBoundCheck->GetSrc2()->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym())"
                             ,
                             "upperBoundCheck->GetSrc2()->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym()"
                            );
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        noImplicitCallArrayUse =
             (ArrayRegOpnd *)GlobOpt::FindArraySegmentLoadInstr(this->globOpt,headSegmentLengthLoad)
        ;
        pOVar9 = IR::Instr::GetDst((Instr *)noImplicitCallArrayUse);
        pRVar10 = IR::Opnd::AsRegOpnd(pOVar9);
        pSVar8 = pRVar10->m_sym;
        pSVar11 = IR::ArrayRegOpnd::HeadSegmentLengthSym(pAStack_20);
        if (pSVar8 != pSVar11) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1256,
                             "(headSegmentLengthLoad->GetDst()->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym())"
                             ,
                             "headSegmentLengthLoad->GetDst()->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym()"
                            );
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        pOVar9 = IR::Instr::GetSrc1((Instr *)noImplicitCallArrayUse);
        this_01 = IR::Opnd::AsIndirOpnd(pOVar9);
        pRVar10 = IR::IndirOpnd::GetBaseOpnd(this_01);
        pSVar8 = pRVar10->m_sym;
        if ((block._5_1_ & 1) == 0) {
          local_f8 = (pAStack_20->super_RegOpnd).m_sym;
        }
        else {
          local_f8 = IR::ArrayRegOpnd::HeadSegmentSym(pAStack_20);
        }
        if (pSVar8 != local_f8) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1259,
                             "(headSegmentLengthLoad->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->m_sym == (isJsArray ? arrayRegOpnd->HeadSegmentSym() : arrayRegOpnd->m_sym))"
                             ,
                             "headSegmentLengthLoad->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->m_sym == (isJsArray ? arrayRegOpnd->HeadSegmentSym() : arrayRegOpnd->m_sym)"
                            );
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        this_00 = headSegmentLengthLoad;
        pOVar9 = IR::Instr::UnlinkSrc1((Instr *)noImplicitCallArrayUse);
        IR::Instr::ReplaceSrc2(this_00,pOVar9);
        *(undefined2 *)&noImplicitCallArrayUse->lengthSym = 6;
        if ((block._5_1_ & 1) != 0) {
          upperBoundCheck._7_1_ = 0;
        }
      }
      if (((upperBoundCheck._7_1_ & 1) != 0) || ((upperBoundCheck._6_1_ & 1) != 0)) {
        use = (Opnd *)0x0;
        if ((block._5_1_ & 1) == 0) {
          if ((upperBoundCheck._6_1_ & 1) != 0) {
            pSVar8 = IR::ArrayRegOpnd::HeadSegmentLengthSym(pAStack_20);
            pOVar9 = FindNoImplicitCallUse<BackwardPass::ProcessArrayRegOpndUse(IR::Instr*,IR::ArrayRegOpnd*)::__1>
                               (this,instr,pSVar8,(anon_class_8_1_0cadc770)&stack0xffffffffffffffe0,
                                (Instr **)&use_1);
            if (pOVar9 != (Opnd *)0x0) {
              if (use_1 == (Opnd *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                   ,0x12a6,"(noImplicitCallUsesInstr)","noImplicitCallUsesInstr");
                if (!bVar3) {
                  pcVar2 = (code *)invalidInstructionException();
                  (*pcVar2)();
                }
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 0;
              }
              pOVar12 = IR::Instr::GetDst((Instr *)use_1);
              if (pOVar12 != (Opnd *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                   ,0x12a7,"(!noImplicitCallUsesInstr->GetDst())",
                                   "!noImplicitCallUsesInstr->GetDst()");
                if (!bVar3) {
                  pcVar2 = (code *)invalidInstructionException();
                  (*pcVar2)();
                }
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 0;
              }
              pOVar12 = IR::Instr::GetSrc1((Instr *)use_1);
              if (pOVar12 == (Opnd *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                   ,0x12a8,"(noImplicitCallUsesInstr->GetSrc1())",
                                   "noImplicitCallUsesInstr->GetSrc1()");
                if (!bVar3) {
                  pcVar2 = (code *)invalidInstructionException();
                  (*pcVar2)();
                }
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 0;
              }
              pOVar12 = IR::Instr::GetSrc1((Instr *)use_1);
              if (pOVar9 == pOVar12) {
                pOVar9 = IR::Instr::GetSrc2((Instr *)use_1);
                if (pOVar9 == (Opnd *)0x0) {
                  IR::Instr::FreeSrc1((Instr *)use_1);
                  *(undefined2 *)&use_1[3]._vptr_Opnd = 6;
                }
                else {
                  pOVar9 = IR::Instr::UnlinkSrc2((Instr *)use_1);
                  IR::Instr::ReplaceSrc1((Instr *)use_1,pOVar9);
                }
              }
              else {
                pOVar12 = IR::Instr::GetSrc2((Instr *)use_1);
                if (pOVar9 != pOVar12) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar7 = 1;
                  bVar3 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                     ,0x12b7,"(use == noImplicitCallUsesInstr->GetSrc2())",
                                     "use == noImplicitCallUsesInstr->GetSrc2()");
                  if (!bVar3) {
                    pcVar2 = (code *)invalidInstructionException();
                    (*pcVar2)();
                  }
                  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar7 = 0;
                }
                IR::Instr::FreeSrc2((Instr *)use_1);
              }
            }
          }
        }
        else {
          noImplicitCallUsesInstr = (Instr *)((long)&block + 6);
          local_70 = (long)&upperBoundCheck + 7;
          local_68 = (undefined1 *)&stack0xffffffffffffffe0;
          local_60 = (bool *)((long)&upperBoundCheck + 6);
          IsCheckedUse.headSegmentIsLoadedButUnused = (bool *)local_70;
          IsCheckedUse.arrayValueType = (ValueType *)noImplicitCallUsesInstr;
          IsCheckedUse.arrayRegOpnd = (ArrayRegOpnd **)local_68;
          IsCheckedUse.headSegmentLengthIsLoadedButUnused = local_60;
          local_58 = FindNoImplicitCallUse<BackwardPass::ProcessArrayRegOpndUse(IR::Instr*,IR::ArrayRegOpnd*)::__0>
                               (this,instr,(Opnd *)pAStack_20,IsCheckedUse,(Instr **)0x0);
          if (local_58 != (Opnd *)0x0) {
            pRVar10 = IR::Opnd::AsRegOpnd(local_58);
            use = (Opnd *)IR::RegOpnd::AsArrayRegOpnd(pRVar10);
          }
        }
        if (((upperBoundCheck._7_1_ & 1) != 0) &&
           ((((block._5_1_ & 1) == 0 ||
             (pSVar8 = IR::ArrayRegOpnd::HeadSegmentLengthSym(pAStack_20), pSVar8 == (StackSym *)0x0
             )) || ((upperBoundCheck._6_1_ & 1) != 0)))) {
          IR::ArrayRegOpnd::RemoveHeadSegmentSym(pAStack_20);
          *(ushort *)&instr->field_0x36 = *(ushort *)&instr->field_0x36 & 0xfbff;
          if (use != (Opnd *)0x0) {
            IR::ArrayRegOpnd::RemoveHeadSegmentSym((ArrayRegOpnd *)use);
          }
        }
        if ((upperBoundCheck._6_1_ & 1) != 0) {
          IR::ArrayRegOpnd::RemoveHeadSegmentLengthSym(pAStack_20);
          *(ushort *)&instr->field_0x36 = *(ushort *)&instr->field_0x36 & 0xf7ff;
          if (use != (Opnd *)0x0) {
            IR::ArrayRegOpnd::RemoveHeadSegmentLengthSym((ArrayRegOpnd *)use);
          }
        }
      }
    }
    if (((block._5_1_ & 1) == 0) || (instr->m_opcode == NoImplicitCallUses)) {
      pSVar8 = IR::ArrayRegOpnd::HeadSegmentSym(pAStack_20);
      if (pSVar8 != (StackSym *)0x0) {
        pSVar8 = IR::ArrayRegOpnd::HeadSegmentSym(pAStack_20);
        ProcessStackSymUse(this,pSVar8,'\x01');
        if ((block._5_1_ & 1) != 0) {
          pBVar1 = pBStack_30->noImplicitCallUses;
          pSVar8 = IR::ArrayRegOpnd::HeadSegmentSym(pAStack_20);
          BVSparse<Memory::JitArenaAllocator>::Set(pBVar1,(pSVar8->super_Sym).m_id);
          pBVar1 = pBStack_30->noImplicitCallJsArrayHeadSegmentSymUses;
          pSVar8 = IR::ArrayRegOpnd::HeadSegmentSym(pAStack_20);
          BVSparse<Memory::JitArenaAllocator>::Set(pBVar1,(pSVar8->super_Sym).m_id);
        }
      }
      pSVar8 = IR::ArrayRegOpnd::HeadSegmentLengthSym(pAStack_20);
      if (pSVar8 != (StackSym *)0x0) {
        if ((block._5_1_ & 1) == 0) {
          pSVar8 = IR::ArrayRegOpnd::HeadSegmentLengthSym(pAStack_20);
          pOVar9 = FindNoImplicitCallUse<BackwardPass::ProcessArrayRegOpndUse(IR::Instr*,IR::ArrayRegOpnd*)::__2>
                             (this,instr,pSVar8,(anon_class_8_1_0cadc770)&stack0xffffffffffffffe0,
                              (Instr **)0x0);
          if (pOVar9 != (Opnd *)0x0) {
            pBVar1 = this->considerSymsAsRealUsesInNoImplicitCallUses;
            pSVar8 = IR::ArrayRegOpnd::HeadSegmentLengthSym(pAStack_20);
            BVSparse<Memory::JitArenaAllocator>::Set(pBVar1,(pSVar8->super_Sym).m_id);
          }
        }
        else {
          pSVar8 = IR::ArrayRegOpnd::HeadSegmentLengthSym(pAStack_20);
          ProcessStackSymUse(this,pSVar8,'\x01');
          pBVar1 = pBStack_30->noImplicitCallUses;
          pSVar8 = IR::ArrayRegOpnd::HeadSegmentLengthSym(pAStack_20);
          BVSparse<Memory::JitArenaAllocator>::Set(pBVar1,(pSVar8->super_Sym).m_id);
          pBVar1 = pBStack_30->noImplicitCallJsArrayHeadSegmentSymUses;
          pSVar8 = IR::ArrayRegOpnd::HeadSegmentLengthSym(pAStack_20);
          BVSparse<Memory::JitArenaAllocator>::Set(pBVar1,(pSVar8->super_Sym).m_id);
        }
      }
      pSVar8 = IR::ArrayRegOpnd::LengthSym(pAStack_20);
      if ((pSVar8 != (StackSym *)0x0) &&
         (pSVar11 = IR::ArrayRegOpnd::HeadSegmentLengthSym(pAStack_20), pSVar8 != pSVar11)) {
        ProcessStackSymUse(this,pSVar8,'\x01');
        bVar3 = ValueType::IsArray((ValueType *)((long)&block + 6));
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1306,"(arrayValueType.IsArray())","arrayValueType.IsArray()");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        BVSparse<Memory::JitArenaAllocator>::Set
                  (pBStack_30->noImplicitCallUses,(pSVar8->super_Sym).m_id);
        BVSparse<Memory::JitArenaAllocator>::Set
                  (pBStack_30->noImplicitCallArrayLengthSymUses,(pSVar8->super_Sym).m_id);
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::ProcessArrayRegOpndUse(IR::Instr *const instr, IR::ArrayRegOpnd *const arrayRegOpnd)
{
    Assert(tag == Js::DeadStorePhase);
    Assert(!IsCollectionPass());
    Assert(instr);
    Assert(arrayRegOpnd);

    if(!(arrayRegOpnd->HeadSegmentSym() || arrayRegOpnd->HeadSegmentLengthSym() || arrayRegOpnd->LengthSym()))
    {
        return;
    }

    const ValueType arrayValueType(arrayRegOpnd->GetValueType());
    const bool isJsArray = !arrayValueType.IsLikelyTypedArray();
    Assert(isJsArray == arrayValueType.IsArrayOrObjectWithArray());
    Assert(!isJsArray == arrayValueType.IsOptimizedTypedArray());

    BasicBlock *const block = currentBlock;
    if(!IsPrePass() &&
        (arrayRegOpnd->HeadSegmentSym() || arrayRegOpnd->HeadSegmentLengthSym()) &&
        (!isJsArray || instr->m_opcode != Js::OpCode::NoImplicitCallUses))
    {
        bool headSegmentIsLoadedButUnused =
            instr->loadedArrayHeadSegment &&
            arrayRegOpnd->HeadSegmentSym() &&
            !block->upwardExposedUses->Test(arrayRegOpnd->HeadSegmentSym()->m_id);
        const bool headSegmentLengthIsLoadedButUnused =
            instr->loadedArrayHeadSegmentLength &&
            arrayRegOpnd->HeadSegmentLengthSym() &&
            !block->upwardExposedUses->Test(arrayRegOpnd->HeadSegmentLengthSym()->m_id);
        if(headSegmentLengthIsLoadedButUnused && instr->extractedUpperBoundCheckWithoutHoisting)
        {
            // Find the upper bound check (index[src1] <= headSegmentLength[src2] + offset[dst])
            IR::Instr *upperBoundCheck = this->globOpt->FindUpperBoundsCheckInstr(instr);
            Assert(upperBoundCheck && upperBoundCheck != instr);
            Assert(upperBoundCheck->GetSrc2()->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym());

            // Find the head segment length load
            IR::Instr *headSegmentLengthLoad = this->globOpt->FindArraySegmentLoadInstr(upperBoundCheck);

            Assert(headSegmentLengthLoad->GetDst()->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym());
            Assert(
                headSegmentLengthLoad->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->m_sym ==
                (isJsArray ? arrayRegOpnd->HeadSegmentSym() : arrayRegOpnd->m_sym));

            // Fold the head segment length load into the upper bound check. Keep the load instruction there with a Nop so that
            // the head segment length sym can be marked as unused before the Nop. The lowerer will remove it.
            upperBoundCheck->ReplaceSrc2(headSegmentLengthLoad->UnlinkSrc1());
            headSegmentLengthLoad->m_opcode = Js::OpCode::Nop;

            if(isJsArray)
            {
                // The head segment length is on the head segment, so the bound check now uses the head segment sym
                headSegmentIsLoadedButUnused = false;
            }
        }

        if(headSegmentIsLoadedButUnused || headSegmentLengthIsLoadedButUnused)
        {
            // Check if the head segment / head segment length are being loaded here. If so, remove them and let the fast
            // path load them since it does a better job.
            IR::ArrayRegOpnd *noImplicitCallArrayUse = nullptr;
            if(isJsArray)
            {
                IR::Opnd *const use =
                    FindNoImplicitCallUse(
                        instr,
                        arrayRegOpnd,
                        [&](IR::Opnd *const checkedSrc) -> bool
                        {
                            const ValueType checkedSrcValueType(checkedSrc->GetValueType());
                            if(!checkedSrcValueType.IsLikelyObject() ||
                                checkedSrcValueType.GetObjectType() != arrayValueType.GetObjectType())
                            {
                                return false;
                            }

                            IR::RegOpnd *const checkedRegSrc = checkedSrc->AsRegOpnd();
                            if(!checkedRegSrc->IsArrayRegOpnd())
                            {
                                return false;
                            }

                            IR::ArrayRegOpnd *const checkedArraySrc = checkedRegSrc->AsArrayRegOpnd();
                            if(headSegmentIsLoadedButUnused &&
                                checkedArraySrc->HeadSegmentSym() != arrayRegOpnd->HeadSegmentSym())
                            {
                                return false;
                            }
                            if(headSegmentLengthIsLoadedButUnused &&
                                checkedArraySrc->HeadSegmentLengthSym() != arrayRegOpnd->HeadSegmentLengthSym())
                            {
                                return false;
                            }
                            return true;
                        });
                if(use)
                {
                    noImplicitCallArrayUse = use->AsRegOpnd()->AsArrayRegOpnd();
                }
            }
            else if(headSegmentLengthIsLoadedButUnused)
            {
                // A typed array's head segment length may be zeroed when the typed array's buffer is transferred to a web
                // worker, so the head segment length sym use is included in a NoImplicitCallUses instruction. Since there
                // are no forward uses of the head segment length sym, to allow removing the extracted head segment length
                // load, the corresponding head segment length sym use in the NoImplicitCallUses instruction must also be
                // removed.
                IR::Instr *noImplicitCallUsesInstr;
                IR::Opnd *const use =
                    FindNoImplicitCallUse(
                        instr,
                        arrayRegOpnd->HeadSegmentLengthSym(),
                        [&](IR::Opnd *const checkedSrc) -> bool
                        {
                            return checkedSrc->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym();
                        },
                        &noImplicitCallUsesInstr);
                if(use)
                {
                    Assert(noImplicitCallUsesInstr);
                    Assert(!noImplicitCallUsesInstr->GetDst());
                    Assert(noImplicitCallUsesInstr->GetSrc1());
                    if(use == noImplicitCallUsesInstr->GetSrc1())
                    {
                        if(noImplicitCallUsesInstr->GetSrc2())
                        {
                            noImplicitCallUsesInstr->ReplaceSrc1(noImplicitCallUsesInstr->UnlinkSrc2());
                        }
                        else
                        {
                            noImplicitCallUsesInstr->FreeSrc1();
                            noImplicitCallUsesInstr->m_opcode = Js::OpCode::Nop;
                        }
                    }
                    else
                    {
                        Assert(use == noImplicitCallUsesInstr->GetSrc2());
                        noImplicitCallUsesInstr->FreeSrc2();
                    }
                }
            }

            if(headSegmentIsLoadedButUnused &&
                (!isJsArray || !arrayRegOpnd->HeadSegmentLengthSym() || headSegmentLengthIsLoadedButUnused))
            {
                // For JS arrays, the head segment length load is dependent on the head segment. So, only remove the head
                // segment load if the head segment length load can also be removed.
                arrayRegOpnd->RemoveHeadSegmentSym();
                instr->loadedArrayHeadSegment = false;
                if(noImplicitCallArrayUse)
                {
                    noImplicitCallArrayUse->RemoveHeadSegmentSym();
                }
            }
            if(headSegmentLengthIsLoadedButUnused)
            {
                arrayRegOpnd->RemoveHeadSegmentLengthSym();
                instr->loadedArrayHeadSegmentLength = false;
                if(noImplicitCallArrayUse)
                {
                    noImplicitCallArrayUse->RemoveHeadSegmentLengthSym();
                }
            }
        }
    }

    if(isJsArray && instr->m_opcode != Js::OpCode::NoImplicitCallUses)
    {
        // Only uses in NoImplicitCallUses instructions are counted toward liveness
        return;
    }

    // Treat dependent syms as uses. For JS arrays, only uses in NoImplicitCallUses count because only then the assumptions made
    // on the dependent syms are guaranteed to be valid. Similarly for typed arrays, a head segment length sym use counts toward
    // liveness only in a NoImplicitCallUses instruction.
    if(arrayRegOpnd->HeadSegmentSym())
    {
        ProcessStackSymUse(arrayRegOpnd->HeadSegmentSym(), true);
        if(isJsArray)
        {
            block->noImplicitCallUses->Set(arrayRegOpnd->HeadSegmentSym()->m_id);
            block->noImplicitCallJsArrayHeadSegmentSymUses->Set(arrayRegOpnd->HeadSegmentSym()->m_id);
        }
    }
    if(arrayRegOpnd->HeadSegmentLengthSym())
    {
        if(isJsArray)
        {
            ProcessStackSymUse(arrayRegOpnd->HeadSegmentLengthSym(), true);
            block->noImplicitCallUses->Set(arrayRegOpnd->HeadSegmentLengthSym()->m_id);
            block->noImplicitCallJsArrayHeadSegmentSymUses->Set(arrayRegOpnd->HeadSegmentLengthSym()->m_id);
        }
        else
        {
            // ProcessNoImplicitCallUses automatically marks JS array reg opnds and their corresponding syms as live. A typed
            // array's head segment length sym also needs to be marked as live at its use in the NoImplicitCallUses instruction,
            // but it is just in a reg opnd. Flag the opnd to have the sym be marked as live when that instruction is processed.
            IR::Opnd *const use =
                FindNoImplicitCallUse(
                    instr,
                    arrayRegOpnd->HeadSegmentLengthSym(),
                    [&](IR::Opnd *const checkedSrc) -> bool
                    {
                        return checkedSrc->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym();
                    });
            if(use)
            {
                considerSymsAsRealUsesInNoImplicitCallUses->Set(arrayRegOpnd->HeadSegmentLengthSym()->m_id);
            }
        }
    }
    StackSym *const lengthSym = arrayRegOpnd->LengthSym();
    if(lengthSym && lengthSym != arrayRegOpnd->HeadSegmentLengthSym())
    {
        ProcessStackSymUse(lengthSym, true);
        Assert(arrayValueType.IsArray());
        block->noImplicitCallUses->Set(lengthSym->m_id);
        block->noImplicitCallArrayLengthSymUses->Set(lengthSym->m_id);
    }
}